

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cc
# Opt level: O2

int sptk::world::anon_unknown_5::ZeroCrossingEngine
              (double *filtered_signal,int y_length,double fs,double *interval_locations,
              double *intervals)

{
  double dVar1;
  double dVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  void *pvVar6;
  ulong uVar7;
  void *pvVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  undefined4 uVar12;
  
  uVar10 = 0xffffffffffffffff;
  if (-1 < y_length) {
    uVar10 = (ulong)(uint)y_length << 2;
  }
  pvVar4 = operator_new__(uVar10);
  uVar9 = y_length - 1;
  uVar7 = 0;
  if (0 < (int)uVar9) {
    uVar7 = (ulong)uVar9;
  }
  for (lVar5 = 1; lVar5 - uVar7 != 1; lVar5 = lVar5 + 1) {
    uVar12 = 0;
    if ((0.0 < filtered_signal[lVar5 + -1]) && (filtered_signal[lVar5] <= 0.0)) {
      uVar12 = (undefined4)lVar5;
    }
    *(undefined4 *)((long)pvVar4 + lVar5 * 4 + -4) = uVar12;
  }
  *(undefined4 *)((long)pvVar4 + (long)(int)uVar9 * 4) = 0;
  pvVar6 = operator_new__(uVar10);
  uVar7 = 0;
  uVar10 = (ulong)(uint)y_length;
  if (y_length < 1) {
    uVar10 = uVar7;
  }
  uVar9 = 0;
  for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    iVar3 = *(int *)((long)pvVar4 + uVar7 * 4);
    if (0 < iVar3) {
      lVar5 = (long)(int)uVar9;
      uVar9 = uVar9 + 1;
      *(int *)((long)pvVar6 + lVar5 * 4) = iVar3;
    }
  }
  uVar11 = 0;
  if (1 < (int)uVar9) {
    pvVar8 = operator_new__((ulong)uVar9 * 8);
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      iVar3 = *(int *)((long)pvVar6 + uVar10 * 4);
      *(double *)((long)pvVar8 + uVar10 * 8) =
           (double)iVar3 -
           filtered_signal[(long)iVar3 + -1] /
           (filtered_signal[iVar3] - filtered_signal[(long)iVar3 + -1]);
    }
    uVar11 = uVar9 - 1;
    for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      dVar1 = *(double *)((long)pvVar8 + uVar10 * 8);
      dVar2 = *(double *)((long)pvVar8 + uVar10 * 8 + 8);
      intervals[uVar10] = fs / (dVar2 - dVar1);
      interval_locations[uVar10] = ((dVar2 + dVar1) * 0.5) / fs;
    }
    operator_delete__(pvVar8);
  }
  operator_delete__(pvVar6);
  operator_delete__(pvVar4);
  return uVar11;
}

Assistant:

static int ZeroCrossingEngine(const double *filtered_signal, int y_length,
    double fs, double *interval_locations, double *intervals) {
  int *negative_going_points = new int[y_length];

  for (int i = 0; i < y_length - 1; ++i)
    negative_going_points[i] =
      0.0 < filtered_signal[i] && filtered_signal[i + 1] <= 0.0 ? i + 1 : 0;
  negative_going_points[y_length - 1] = 0;

  int *edges = new int[y_length];
  int count = 0;
  for (int i = 0; i < y_length; ++i)
    if (negative_going_points[i] > 0)
      edges[count++] = negative_going_points[i];

  if (count < 2) {
    delete[] edges;
    delete[] negative_going_points;
    return 0;
  }

  double *fine_edges = new double[count];
  for (int i = 0; i < count; ++i)
    fine_edges[i] =
      edges[i] - filtered_signal[edges[i] - 1] /
      (filtered_signal[edges[i]] - filtered_signal[edges[i] - 1]);

  for (int i = 0; i < count - 1; ++i) {
    intervals[i] = fs / (fine_edges[i + 1] - fine_edges[i]);
    interval_locations[i] = (fine_edges[i] + fine_edges[i + 1]) / 2.0 / fs;
  }

  delete[] fine_edges;
  delete[] edges;
  delete[] negative_going_points;
  return count - 1;
}